

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  bool bVar1;
  reference paVar2;
  AssertHelper local_c0;
  Message local_b8 [2];
  CfdException *anon_var_0;
  undefined1 local_a0 [8];
  ByteData actual;
  bool gtest_caught_expected;
  ConstCharPtr local_78;
  ConstCharPtr gtest_msg;
  CombinePubkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,secp.secp256k1_context_);
  __end1 = std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>::begin
                     (&combine_error_vectors);
  test_vector.expect.field_2._8_8_ =
       std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>::end
                 (&combine_error_vectors);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
                                *)((long)&test_vector.expect.field_2 + 8));
    if (!bVar1) {
      return;
    }
    paVar2 = __gnu_cxx::
             __normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_56_2_5c921040::CombinePubkeyTestVector
              ((anon_struct_56_2_5c921040 *)&gtest_msg,paVar2);
    testing::internal::ConstCharPtr::ConstCharPtr(&local_78,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_78);
    if (bVar1) {
      actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
                  ((ByteData *)local_a0,(Secp256k1 *)&__range1,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg);
        cfd::core::ByteData::~ByteData((ByteData *)local_a0);
      }
      if ((actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        local_78.value =
             "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
        goto LAB_004c5c6a;
      }
    }
    else {
LAB_004c5c6a:
      testing::Message::Message(local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x9c,local_78.value);
      testing::internal::AssertHelper::operator=(&local_c0,local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(local_b8);
    }
    anon_struct_56_2_5c921040::~CombinePubkeyTestVector((anon_struct_56_2_5c921040 *)&gtest_msg);
    __gnu_cxx::
    __normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}